

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

void __thiscall cmCTestGIT::CommitParser::DoHeaderLine(CommitParser *this)

{
  bool bVar1;
  long lVar2;
  string_view sVar3;
  string local_150;
  undefined1 local_130 [8];
  Person committer;
  string local_d0;
  undefined1 local_a0 [8];
  Person author;
  string local_40 [32];
  string_view local_20;
  CommitParser *local_10;
  CommitParser *this_local;
  
  local_10 = this;
  local_20 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)&(this->super_DiffParser).super_LineParser.Line);
  bVar1 = cmHasLiteralPrefix<8ul>(local_20,(char (*) [8])"commit ");
  if (bVar1) {
    std::__cxx11::string::substr
              ((ulong)local_40,(ulong)&(this->super_DiffParser).super_LineParser.Line);
    std::__cxx11::string::operator=((string *)&this->Rev,local_40);
    std::__cxx11::string::~string(local_40);
  }
  else {
    sVar3 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)&(this->super_DiffParser).super_LineParser.Line);
    author.TimeZone = sVar3._M_len;
    bVar1 = cmHasLiteralPrefix<8ul>(sVar3,(char (*) [8])"author ");
    if (bVar1) {
      Person::Person((Person *)local_a0);
      lVar2 = std::__cxx11::string::c_str();
      ParsePerson(this,(char *)(lVar2 + 7),(Person *)local_a0);
      std::__cxx11::string::operator=((string *)&(this->Rev).Author,(string *)local_a0);
      std::__cxx11::string::operator=
                ((string *)&(this->Rev).EMail,(string *)(author.Name.field_2._M_local_buf + 8));
      FormatDateTime_abi_cxx11_(&local_d0,this,(Person *)local_a0);
      std::__cxx11::string::operator=((string *)&(this->Rev).Date,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      Person::~Person((Person *)local_a0);
    }
    else {
      sVar3 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&(this->super_DiffParser).super_LineParser.Line);
      committer.TimeZone = sVar3._M_len;
      bVar1 = cmHasLiteralPrefix<11ul>(sVar3,(char (*) [11])"committer ");
      if (bVar1) {
        Person::Person((Person *)local_130);
        lVar2 = std::__cxx11::string::c_str();
        ParsePerson(this,(char *)(lVar2 + 10),(Person *)local_130);
        std::__cxx11::string::operator=((string *)&(this->Rev).Committer,(string *)local_130);
        std::__cxx11::string::operator=
                  ((string *)&(this->Rev).CommitterEMail,
                   (string *)(committer.Name.field_2._M_local_buf + 8));
        FormatDateTime_abi_cxx11_(&local_150,this,(Person *)local_130);
        std::__cxx11::string::operator=((string *)&(this->Rev).CommitDate,(string *)&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        Person::~Person((Person *)local_130);
      }
    }
  }
  return;
}

Assistant:

void DoHeaderLine()
  {
    // Look for header fields that we need.
    if (cmHasLiteralPrefix(this->Line, "commit ")) {
      this->Rev.Rev = this->Line.substr(7);
    } else if (cmHasLiteralPrefix(this->Line, "author ")) {
      Person author;
      this->ParsePerson(this->Line.c_str() + 7, author);
      this->Rev.Author = author.Name;
      this->Rev.EMail = author.EMail;
      this->Rev.Date = this->FormatDateTime(author);
    } else if (cmHasLiteralPrefix(this->Line, "committer ")) {
      Person committer;
      this->ParsePerson(this->Line.c_str() + 10, committer);
      this->Rev.Committer = committer.Name;
      this->Rev.CommitterEMail = committer.EMail;
      this->Rev.CommitDate = this->FormatDateTime(committer);
    }
  }